

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterATT.c
# Opt level: O2

ZyanStatus
ZydisFormatterATTPrintAddressABS
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  ZyanStatus ZVar1;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x170,
                  "ZyanStatus ZydisFormatterATTPrintAddressABS(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer != (ZydisFormatterBuffer *)0x0) {
    if (context == (ZydisFormatterContext *)0x0) {
      __assert_fail("context",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                    ,0x172,
                    "ZyanStatus ZydisFormatterATTPrintAddressABS(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                   );
    }
    if (((context->instruction->meta).branch_type != ZYDIS_BRANCH_TYPE_NONE) &&
       (context->operand->type == ZYDIS_OPERAND_TYPE_MEMORY)) {
      if (buffer->is_token_list == '\0') {
        ZVar1 = ZydisStringAppendShort(&buffer->string,&STR_MUL);
      }
      else {
        ZVar1 = ZydisFormatterBufferAppendPredefined(buffer,(ZydisPredefinedToken *)&TOK_DATA_MUL);
      }
      if ((int)ZVar1 < 0) {
        return ZVar1;
      }
    }
    ZVar1 = ZydisFormatterBasePrintAddressABS(formatter,buffer,context);
    return ZVar1;
  }
  __assert_fail("buffer",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                ,0x171,
                "ZyanStatus ZydisFormatterATTPrintAddressABS(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
               );
}

Assistant:

ZyanStatus ZydisFormatterATTPrintAddressABS(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

    if ((context->instruction->meta.branch_type != ZYDIS_BRANCH_TYPE_NONE) &&
        (context->operand->type == ZYDIS_OPERAND_TYPE_MEMORY))
    {
        ZYDIS_BUFFER_APPEND(buffer, MUL);
    }

    return ZydisFormatterBasePrintAddressABS(formatter, buffer, context);
}